

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArray.h
# Opt level: O0

MomentumType * __thiscall
pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>::ConstParticleRef::getMomentum
          (ConstParticleRef *this)

{
  const_reference pvVar1;
  double *pdVar2;
  long *in_RSI;
  long *plVar3;
  MomentumType *in_RDI;
  Vector3<double> *this_00;
  int d;
  MomentumType result;
  double in_stack_ffffffffffffff98;
  double a;
  Vector3<double> *in_stack_ffffffffffffffa0;
  uint local_24;
  Vector3<double> local_20;
  
  this_00 = &local_20;
  plVar3 = in_RSI;
  Vector3<double>::Vector3(this_00);
  for (local_24 = 0; (int)local_24 < 3; local_24 = local_24 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (*in_RSI + 0x48 + (long)(int)local_24 * 0x18),(long)(int)in_RSI[1]);
    in_stack_ffffffffffffffa0 = (Vector3<double> *)*pvVar1;
    plVar3 = (long *)(ulong)local_24;
    this_00 = &local_20;
    pdVar2 = Vector3<double>::operator[](this_00,local_24);
    *pdVar2 = (double)in_stack_ffffffffffffffa0;
  }
  Constants<double>::c(this_00,plVar3);
  pica::operator*(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  a = ParticleTypes::types;
  std::vector<short,_std::allocator<short>_>::operator[]
            ((vector<short,_std::allocator<short>_> *)(*in_RSI + 0xc0),(long)(int)in_RSI[1]);
  pica::operator*(in_stack_ffffffffffffffa0,a);
  return in_RDI;
}

Assistant:

MomentumType getMomentum() const {
            MomentumType result;
            for (int d = 0; d < momentumDimension; d++)
                result[d] = particles.ps[d][idx];
            return result * Constants<GammaType>::c() * pica::ParticleTypes::types[particles.typeIndex[idx]].mass;
        }